

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

state * __thiscall parser::state::operator++(state *this)

{
  ulong uVar1;
  size_type sVar2;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference pvVar3;
  void *__buf;
  int in_ESI;
  state *in_RDI;
  ind j;
  ind i;
  
  uVar1 = (in_RDI->pos).i - (in_RDI->off).i;
  sVar2 = std::deque<char,_std::allocator<char>_>::size
                    ((deque<char,_std::allocator<char>_> *)0x1a79f2);
  if (uVar1 < sVar2) {
    (in_RDI->pos).i = (in_RDI->pos).i + 1;
    sVar2 = std::deque<char,_std::allocator<char>_>::size
                      ((deque<char,_std::allocator<char>_> *)0x1a7a39);
    if ((uVar1 + 1 == sVar2) && (uVar1 = read(in_RDI,in_ESI,__buf,sVar2), (uVar1 & 1) == 0)) {
      (in_RDI->pos).cl = (in_RDI->pos).cl + 1;
    }
    else {
      this_00 = (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((in_RDI->pos).ln - (in_RDI->off).ln);
      sVar2 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a7a97);
      if (this_00 != (deque<unsigned_long,_std::allocator<unsigned_long>_> *)(sVar2 - 1)) {
        sVar2 = (in_RDI->pos).i;
        pvVar3 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (this_00,sVar2);
        if (*pvVar3 <= sVar2) {
          (in_RDI->pos).ln = (in_RDI->pos).ln + 1;
          (in_RDI->pos).cl = 0;
          return in_RDI;
        }
      }
      (in_RDI->pos).cl = (in_RDI->pos).cl + 1;
    }
  }
  return in_RDI;
}

Assistant:

state& operator ++ () {
			ind i = pos.i - off.i;
			
			// ignore if already end of stream
			if ( i >= str.size() ) return *this;
			
			// update index
			++pos.i;
			
			// read more input if neccessary, terminating on end-of-stream
			if ( ++i == str.size() && !read() ) { ++pos.cl; return *this; }
			
			// update row and column
			ind j = pos.ln - off.ln;
			if ( j == lines.size() - 1 || pos.i < lines[j+1] ) {
				++pos.cl;
			} else {
				++pos.ln;
				pos.cl = 0;
			}
			
			return *this;
		}